

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.h
# Opt level: O2

CCharmapToUni * __thiscall CVmObjCharSet::get_to_uni(CVmObjCharSet *this)

{
  CCharmapToUni *pCVar1;
  
  pCVar1 = *(CCharmapToUni **)((this->super_CVmObject).ext_ + 8);
  if (pCVar1 != (CCharmapToUni *)0x0) {
    return pCVar1;
  }
  CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.charset_unknown_exc,0,"unknown character set")
  ;
}

Assistant:

const struct vmobj_charset_ext_t *get_ext_ptr() const
        { return (vmobj_charset_ext_t *)ext_; }